

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateImportTargetCode
          (cmExportBuildAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target)

{
  ostream *poVar1;
  char *path_00;
  string path;
  string targetName;
  allocator local_91;
  string local_90;
  string local_70 [32];
  string local_50;
  string local_30;
  
  std::__cxx11::string::string
            (local_70,(string *)
                      &(this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.
                       Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_90,target);
  std::__cxx11::string::append(local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar1 = std::operator<<(os,local_70);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := ");
  std::__cxx11::string::string((string *)&local_50,"",&local_91);
  cmGeneratorTarget::GetFullPath(&local_30,target,&local_50,RuntimeBinaryArtifact,false);
  cmSystemTools::ConvertToOutputPath_abi_cxx11_
            (&local_90,(cmSystemTools *)local_30._M_dataplus._M_p,path_00);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<(os,(string *)&local_90);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, const cmGeneratorTarget* target)
{
  std::string targetName = this->Namespace;
  targetName += target->GetExportName();
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := ";
  std::string path =
    cmSystemTools::ConvertToOutputPath(target->GetFullPath().c_str());
  os << path << "\n";
}